

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O3

void __thiscall xmrig::Miner::stop(Miner *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  Nonce::stop();
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->d_ptr->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_IBackend[0xb])();
  }
  return;
}

Assistant:

void xmrig::Miner::stop()
{
    Nonce::stop();

    for (IBackend *backend : d_ptr->backends) {
        backend->stop();
    }
}